

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

uint64_t uv__read_proc_meminfo(char *what)

{
  int iVar1;
  size_t sVar2;
  char local_1028 [8];
  char buf [4096];
  char *p;
  uint64_t rc;
  char *what_local;
  
  rc = (uint64_t)what;
  iVar1 = uv__slurp("/proc/meminfo",local_1028,0x1000);
  if (iVar1 == 0) {
    buf._4088_8_ = strstr(local_1028,(char *)rc);
    if ((char *)buf._4088_8_ == (char *)0x0) {
      what_local = (char *)0x0;
    }
    else {
      sVar2 = strlen((char *)rc);
      buf._4088_8_ = sVar2 + buf._4088_8_;
      p = (char *)0x0;
      sscanf((char *)buf._4088_8_,"%lu kB",&p);
      what_local = (char *)((long)p << 10);
    }
  }
  else {
    what_local = (char *)0x0;
  }
  return (uint64_t)what_local;
}

Assistant:

static uint64_t uv__read_proc_meminfo(const char* what) {
  uint64_t rc;
  char* p;
  char buf[4096];  /* Large enough to hold all of /proc/meminfo. */

  if (uv__slurp("/proc/meminfo", buf, sizeof(buf)))
    return 0;

  p = strstr(buf, what);

  if (p == NULL)
    return 0;

  p += strlen(what);

  rc = 0;
  sscanf(p, "%" PRIu64 " kB", &rc);

  return rc * 1024;
}